

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalComparisonJoin::Serialize(LogicalComparisonJoin *this,Serializer *serializer)

{
  ulong in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  LogicalOperator::Serialize((LogicalOperator *)this,serializer);
  Serializer::WriteProperty<duckdb::JoinType>
            (serializer,200,"join_type",&(this->super_LogicalJoin).super_LogicalOperator.field_0x61)
  ;
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xc9,"mark_index",&(this->super_LogicalJoin).mark_index);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0xca,"left_projection_map",&(this->super_LogicalJoin).left_projection_map);
  Serializer::WritePropertyWithDefault<duckdb::vector<unsigned_long,true>>
            (serializer,0xcb,"right_projection_map",&(this->super_LogicalJoin).right_projection_map)
  ;
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::JoinCondition,true>>
            (serializer,0xcc,"conditions",&this->conditions);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xcd,"mark_types",&this->mark_types);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xce,"duplicate_eliminated_columns",&this->duplicate_eliminated_columns);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xcf,"delim_flipped",&this->delim_flipped,(bool *)((long)&uStack_18 + 7));
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            (serializer,0xd0,"predicate",&this->predicate);
  return;
}

Assistant:

void LogicalComparisonJoin::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WriteProperty<JoinType>(200, "join_type", join_type);
	serializer.WritePropertyWithDefault<idx_t>(201, "mark_index", mark_index);
	serializer.WritePropertyWithDefault<vector<idx_t>>(202, "left_projection_map", left_projection_map);
	serializer.WritePropertyWithDefault<vector<idx_t>>(203, "right_projection_map", right_projection_map);
	serializer.WritePropertyWithDefault<vector<JoinCondition>>(204, "conditions", conditions);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(205, "mark_types", mark_types);
	serializer.WritePropertyWithDefault<vector<unique_ptr<Expression>>>(206, "duplicate_eliminated_columns", duplicate_eliminated_columns);
	serializer.WritePropertyWithDefault<bool>(207, "delim_flipped", delim_flipped, false);
	serializer.WritePropertyWithDefault<unique_ptr<Expression>>(208, "predicate", predicate);
}